

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL is_child_scope(JSContext *ctx,JSFunctionDef *fd,int scope,int parent_scope)

{
  int parent_scope_local;
  int scope_local;
  JSFunctionDef *fd_local;
  JSContext *ctx_local;
  
  scope_local = scope;
  while( true ) {
    if (scope_local < 0) {
      return 0;
    }
    if (scope_local == parent_scope) break;
    scope_local = fd->scopes[scope_local].parent;
  }
  return 1;
}

Assistant:

static BOOL is_child_scope(JSContext *ctx, JSFunctionDef *fd,
                           int scope, int parent_scope)
{
    while (scope >= 0) {
        if (scope == parent_scope)
            return TRUE;
        scope = fd->scopes[scope].parent;
    }
    return FALSE;
}